

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O1

QString * QTimeZonePrivate::isoOffsetFormat
                    (QString *__return_storage_ptr__,int offsetFromUtc,NameType mode)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long in_FS_OFFSET;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (offsetFromUtc == 0 && (mode ^ ShortName) == DefaultName) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = L"UTC";
    (__return_storage_ptr__->d).size = 3;
  }
  else {
    uVar1 = (ulong)(uint)-offsetFromUtc;
    if (0 < offsetFromUtc) {
      uVar1 = (ulong)(uint)offsetFromUtc;
    }
    iVar3 = (int)(uVar1 / 0x3c);
    uVar2 = (int)uVar1 + iVar3 * -0x3c;
    uVar4 = iVar3 + (int)(uVar1 / 0xe10) * -0x3c;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined4 *)&(__return_storage_ptr__->d).d = 0xaaaaaaaa;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = 0xaaaaaaaa;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = 0xaaaaaaaa;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = 0xaaaaaaaa;
    QString::asprintf((char **)__return_storage_ptr__,"UTC%c%02d",
                      (ulong)((offsetFromUtc >> 0x1f) * -2 + 0x2b),uVar1 / 0xe10);
    if ((mode ^ ShortName) != DefaultName || (uVar4 != 0 || uVar2 != 0)) {
      QString::asprintf((char **)&local_48,":%02d",(ulong)uVar4);
      QString::append(__return_storage_ptr__,&local_48);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if (mode == LongName || uVar2 != 0) {
      QString::asprintf((char **)&local_48,":%02d",(ulong)uVar2);
      QString::append(__return_storage_ptr__,&local_48);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QTimeZonePrivate::isoOffsetFormat(int offsetFromUtc, QTimeZone::NameType mode)
{
    if (mode == QTimeZone::ShortName && !offsetFromUtc)
        return utcQString();

    char sign = '+';
    if (offsetFromUtc < 0) {
        sign = '-';
        offsetFromUtc = -offsetFromUtc;
    }
    const int secs = offsetFromUtc % 60;
    const int mins = (offsetFromUtc / 60) % 60;
    const int hour = offsetFromUtc / 3600;
    QString result = QString::asprintf("UTC%c%02d", sign, hour);
    if (mode != QTimeZone::ShortName || secs || mins)
        result += QString::asprintf(":%02d", mins);
    if (mode == QTimeZone::LongName || secs)
        result += QString::asprintf(":%02d", secs);
    return result;
}